

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  AssertionResult *unaff_retaddr;
  char **pointer;
  Message *in_stack_ffffffffffffffd0;
  char *local_18;
  AssertionResult *a_message;
  
  pointer = &local_18;
  a_message = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<(in_stack_ffffffffffffffd0,pointer);
  AppendMessage(unaff_retaddr,(Message *)a_message);
  Message::~Message((Message *)0x1f71c8);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }